

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O1

void sysbvm_sourcePosition_dump(sysbvm_context_t *context,sysbvm_tuple_t sourcePosition)

{
  ulong uVar1;
  uint uVar2;
  uint32_t endColumn;
  uint32_t endLine;
  uint32_t startColumn;
  uint32_t startLine;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  
  if ((sourcePosition & 0xf) == 0 && sourcePosition != 0) {
    uVar2 = 0;
    local_2c = 0;
    local_30 = 0;
    local_34 = 0;
    local_38 = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex
              (context,*(sysbvm_tuple_t *)(sourcePosition + 0x10),
               *(sysbvm_tuple_t *)(sourcePosition + 0x18),&local_2c,&local_30);
    sysbvm_sourceCode_computeLineAndColumnForIndex
              (context,*(sysbvm_tuple_t *)(sourcePosition + 0x10),
               *(sysbvm_tuple_t *)(sourcePosition + 0x20),&local_34,&local_38);
    uVar1 = *(ulong *)(sourcePosition + 0x10);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar1 = *(ulong *)(uVar1 + 0x20);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        uVar2 = *(uint *)(uVar1 + 0xc);
      }
      printf("%.*s:%d.%d-%d.%d\n",(ulong)uVar2,uVar1 + 0x10,(ulong)local_2c,(ulong)local_30,
             (ulong)local_34,local_38);
    }
    else {
      printf("unknown:%d.%d-%d.%d\n",(ulong)local_2c,(ulong)local_30,(ulong)local_34,(ulong)local_38
            );
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_sourcePosition_dump(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition)
{
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition)) return;

    sysbvm_sourcePosition_t *sourcePositionObject = (sysbvm_sourcePosition_t*)sourcePosition;
    uint32_t startLine = 0;
    uint32_t startColumn = 0;
    uint32_t endLine = 0;
    uint32_t endColumn = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePositionObject->sourceCode, sourcePositionObject->startIndex, &startLine, &startColumn);
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePositionObject->sourceCode, sourcePositionObject->endIndex, &endLine, &endColumn);
    
    if(sysbvm_tuple_isNonNullPointer(sourcePositionObject->sourceCode))
    {
        sysbvm_sourceCode_t *sourceCode = (sysbvm_sourceCode_t*)sourcePositionObject->sourceCode;
        printf(SYSBVM_STRING_PRINTF_FORMAT ":%d.%d-%d.%d\n", SYSBVM_STRING_PRINTF_ARG(sourceCode->name),
            startLine, startColumn, endLine, endColumn);
    }
    else
    {
        printf("unknown:%d.%d-%d.%d\n", startLine, startColumn, endLine, endColumn);
    }
}